

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUrightNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhs,int *ridx,int rn,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  undefined8 uVar3;
  bool bVar4;
  type_conflict5 tVar5;
  int iVar6;
  uint uVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int *piVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_30c;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2c8;
  int local_28c;
  int *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  cpp_dec_float<50U,_int,_void> local_278;
  int *local_238;
  int *local_230;
  pointer local_228;
  int *local_220;
  int *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  int *local_208;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  uint *local_1f8;
  int *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_2c8.fpclass = cpp_dec_float_finite;
  local_2c8.prec_elem = 10;
  local_2c8.data._M_elems[0] = 0;
  local_2c8.data._M_elems[1] = 0;
  local_2c8.data._M_elems[2] = 0;
  local_2c8.data._M_elems[3] = 0;
  local_2c8.data._M_elems[4] = 0;
  local_2c8.data._M_elems[5] = 0;
  local_2c8.data._M_elems._24_5_ = 0;
  local_2c8.data._M_elems[7]._1_3_ = 0;
  local_2c8.data._M_elems._32_5_ = 0;
  local_2c8.data._M_elems[9]._1_3_ = 0;
  local_2c8.exp = 0;
  local_2c8.neg = false;
  local_278.fpclass = cpp_dec_float_finite;
  local_278.prec_elem = 10;
  local_278.data._M_elems[0] = 0;
  local_278.data._M_elems[1] = 0;
  local_278.data._M_elems[2] = 0;
  local_278.data._M_elems[3] = 0;
  local_278.data._M_elems[4] = 0;
  local_278.data._M_elems[5] = 0;
  local_278.data._M_elems._24_5_ = 0;
  local_278.data._M_elems[7]._1_3_ = 0;
  local_278.data._M_elems._32_5_ = 0;
  local_278.data._M_elems[9]._1_3_ = 0;
  local_278.exp = 0;
  local_278.neg = false;
  local_208 = (this->row).orig;
  local_1f0 = (this->row).perm;
  local_218 = (this->col).orig;
  local_220 = (this->u).col.idx;
  local_228 = (this->u).col.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = (this->u).col.len;
  local_238 = (this->u).col.start;
  local_30c = rn;
  local_280 = eps;
  local_210 = vec;
  local_200 = this;
  local_1f8 = (uint *)ridx;
LAB_0025965e:
  if (0 < local_30c) {
    uVar7 = *local_1f8;
    if ((double)local_30c <= (double)(int)uVar7 * 0.2) {
      iVar6 = deQueueMax((int *)local_1f8,&local_30c);
      iVar10 = local_208[iVar6];
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems._24_5_ = 0;
      local_308.data._M_elems[7]._1_3_ = 0;
      local_308.data._M_elems._32_5_ = 0;
      local_308.data._M_elems[9]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_308,
                 &(local_200->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar10].m_backend,&rhs[iVar10].m_backend
                );
      local_2c8.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
      local_2c8.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
      local_2c8.data._M_elems[4] = local_308.data._M_elems[4];
      local_2c8.data._M_elems[5] = local_308.data._M_elems[5];
      local_2c8.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
      local_2c8.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
      local_2c8.data._M_elems[0] = local_308.data._M_elems[0];
      local_2c8.data._M_elems[1] = local_308.data._M_elems[1];
      local_2c8.data._M_elems[2] = local_308.data._M_elems[2];
      local_2c8.data._M_elems[3] = local_308.data._M_elems[3];
      local_2c8.exp = local_308.exp;
      local_2c8.neg = local_308.neg;
      local_2c8.fpclass = local_308.fpclass;
      local_2c8.prec_elem = local_308.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&rhs[iVar10].m_backend,0);
      local_e8.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
      local_e8.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
      local_e8.m_backend.data._M_elems[0] = local_2c8.data._M_elems[0];
      local_e8.m_backend.data._M_elems[1] = local_2c8.data._M_elems[1];
      local_e8.m_backend.data._M_elems[2] = local_2c8.data._M_elems[2];
      local_e8.m_backend.data._M_elems[3] = local_2c8.data._M_elems[3];
      local_e8.m_backend.data._M_elems[4] = local_2c8.data._M_elems[4];
      local_e8.m_backend.data._M_elems[5] = local_2c8.data._M_elems[5];
      local_e8.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
      local_e8.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
      local_e8.m_backend.exp = local_2c8.exp;
      local_e8.m_backend.neg = local_2c8.neg;
      local_e8.m_backend.fpclass = local_2c8.fpclass;
      local_e8.m_backend.prec_elem = local_2c8.prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_280->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 8);
      local_128.m_backend.exp = (local_280->m_backend).exp;
      local_128.m_backend.neg = (local_280->m_backend).neg;
      local_128.m_backend.fpclass = (local_280->m_backend).fpclass;
      local_128.m_backend.prec_elem = (local_280->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_e8,&local_128);
      if (bVar4) {
        iVar10 = local_218[iVar6];
        *(ulong *)(local_210[iVar10].m_backend.data._M_elems + 8) =
             CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_);
        puVar2 = local_210[iVar10].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_2c8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_);
        *(undefined8 *)local_210[iVar10].m_backend.data._M_elems = local_2c8.data._M_elems._0_8_;
        *(undefined8 *)(local_210[iVar10].m_backend.data._M_elems + 2) =
             local_2c8.data._M_elems._8_8_;
        local_210[iVar10].m_backend.exp = local_2c8.exp;
        local_210[iVar10].m_backend.neg = local_2c8.neg;
        local_210[iVar10].m_backend.fpclass = local_2c8.fpclass;
        local_210[iVar10].m_backend.prec_elem = local_2c8.prec_elem;
        pcVar8 = &local_228[local_238[iVar10]].m_backend;
        piVar9 = local_220 + local_238[iVar10];
        for (iVar10 = local_230[iVar10]; 0 < iVar10; iVar10 = iVar10 + -1) {
          iVar6 = *piVar9;
          pnVar1 = rhs + iVar6;
          uVar3 = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 8);
          local_278.data._M_elems._32_5_ = SUB85(uVar3,0);
          local_278.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_278.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
          local_278.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
          puVar2 = rhs[iVar6].m_backend.data._M_elems + 4;
          local_278.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar3 = *(undefined8 *)(puVar2 + 2);
          local_278.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_278.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_278.exp = rhs[iVar6].m_backend.exp;
          local_278.neg = rhs[iVar6].m_backend.neg;
          local_278.fpclass = rhs[iVar6].m_backend.fpclass;
          local_278.prec_elem = rhs[iVar6].m_backend.prec_elem;
          local_308.data._M_elems._0_8_ = local_308.data._M_elems._0_8_ & 0xffffffff00000000;
          local_28c = iVar10;
          local_288 = piVar9;
          tVar5 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_278,(int *)&local_308);
          if (tVar5) {
            local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
            local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
            local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
            local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
            uVar3 = local_1e8.data._M_elems._0_8_;
            local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
            local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
            local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
            local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
            local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
            local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
            local_1e8.exp = local_2c8.exp;
            local_1e8.neg = local_2c8.neg;
            local_1e8.fpclass = local_2c8.fpclass;
            local_1e8.prec_elem = local_2c8.prec_elem;
            local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
            if (local_2c8.fpclass != cpp_dec_float_finite || local_1e8.data._M_elems[0] != 0) {
              local_1e8.neg = (bool)(local_2c8.neg ^ 1);
            }
            local_308.fpclass = cpp_dec_float_finite;
            local_308.prec_elem = 10;
            local_308.data._M_elems[0] = 0;
            local_308.data._M_elems[1] = 0;
            local_308.data._M_elems[2] = 0;
            local_308.data._M_elems[3] = 0;
            local_308.data._M_elems[4] = 0;
            local_308.data._M_elems[5] = 0;
            local_308.data._M_elems._24_5_ = 0;
            local_308.data._M_elems[7]._1_3_ = 0;
            local_308.data._M_elems._32_5_ = 0;
            local_308.data._M_elems[9]._1_3_ = 0;
            local_308.exp = 0;
            local_308.neg = false;
            local_1e8.data._M_elems._0_8_ = uVar3;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_308,&local_1e8,pcVar8);
            local_1a8.m_backend.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
            local_1a8.m_backend.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
            local_278.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
            local_278.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
            local_1a8.m_backend.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
            local_1a8.m_backend.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
            local_278.data._M_elems[4] = local_308.data._M_elems[4];
            local_278.data._M_elems[5] = local_308.data._M_elems[5];
            local_278.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
            local_278.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
            local_278.data._M_elems[0] = local_308.data._M_elems[0];
            local_278.data._M_elems[1] = local_308.data._M_elems[1];
            local_278.data._M_elems[2] = local_308.data._M_elems[2];
            local_278.data._M_elems[3] = local_308.data._M_elems[3];
            local_278.exp = local_308.exp;
            local_278.neg = local_308.neg;
            local_1a8.m_backend.fpclass = local_308.fpclass;
            local_1a8.m_backend.prec_elem = local_308.prec_elem;
            local_278.fpclass = local_308.fpclass;
            local_278.prec_elem = local_308.prec_elem;
            local_1a8.m_backend.data._M_elems[0] = local_308.data._M_elems[0];
            local_1a8.m_backend.data._M_elems[1] = local_308.data._M_elems[1];
            local_1a8.m_backend.data._M_elems[2] = local_308.data._M_elems[2];
            local_1a8.m_backend.data._M_elems[3] = local_308.data._M_elems[3];
            local_1a8.m_backend.data._M_elems[4] = local_308.data._M_elems[4];
            local_1a8.m_backend.data._M_elems[5] = local_308.data._M_elems[5];
            local_1a8.m_backend.exp = local_308.exp;
            local_1a8.m_backend.neg = local_308.neg;
            local_168.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((local_280->m_backend).data._M_elems + 8);
            local_168.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(local_280->m_backend).data._M_elems;
            local_168.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((local_280->m_backend).data._M_elems + 2);
            local_168.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((local_280->m_backend).data._M_elems + 4);
            local_168.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((local_280->m_backend).data._M_elems + 6);
            local_168.m_backend.exp = (local_280->m_backend).exp;
            local_168.m_backend.neg = (local_280->m_backend).neg;
            local_168.m_backend.fpclass = (local_280->m_backend).fpclass;
            local_168.m_backend.prec_elem = (local_280->m_backend).prec_elem;
            bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1a8,&local_168);
            piVar9 = local_288;
            iVar10 = local_28c;
            if (bVar4) {
              *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                   CONCAT35(local_278.data._M_elems[9]._1_3_,local_278.data._M_elems._32_5_);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_278.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_278.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_278.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_278.exp;
              (pnVar1->m_backend).neg = local_278.neg;
              (pnVar1->m_backend).fpclass = local_278.fpclass;
              (pnVar1->m_backend).prec_elem = local_278.prec_elem;
              enQueueMax((int *)local_1f8,&local_30c,local_1f0[iVar6]);
            }
          }
          else {
            local_308.fpclass = cpp_dec_float_finite;
            local_308.prec_elem = 10;
            local_308.data._M_elems[0] = 0;
            local_308.data._M_elems[1] = 0;
            local_308.data._M_elems[2] = 0;
            local_308.data._M_elems[3] = 0;
            local_308.data._M_elems[4] = 0;
            local_308.data._M_elems[5] = 0;
            local_308.data._M_elems._24_5_ = 0;
            local_308.data._M_elems[7]._1_3_ = 0;
            local_308.data._M_elems._32_5_ = 0;
            local_308.data._M_elems[9]._1_3_ = 0;
            local_308.exp = 0;
            local_308.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_308,&local_2c8,pcVar8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_278,&local_308);
            local_1e8.data._M_elems._0_8_ = local_1e8.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar5 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_278,(int *)&local_1e8);
            uVar11 = 0xe48e0530;
            uVar12 = 0x2b2bff2e;
            if (!tVar5) {
              uVar11 = 0;
              uVar12 = 0;
            }
            local_308.data._M_elems._0_8_ = CONCAT44(uVar12,uVar11);
            boost::multiprecision::default_ops::
            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                      (&local_278,(double *)&local_308);
            *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                 CONCAT35(local_278.data._M_elems[9]._1_3_,local_278.data._M_elems._32_5_);
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_278.data._M_elems._16_8_;
            *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                 CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
            *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_278.data._M_elems._0_8_;
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_278.data._M_elems._8_8_;
            (pnVar1->m_backend).exp = local_278.exp;
            (pnVar1->m_backend).neg = local_278.neg;
            (pnVar1->m_backend).fpclass = local_278.fpclass;
            (pnVar1->m_backend).prec_elem = local_278.prec_elem;
            piVar9 = local_288;
            iVar10 = local_28c;
          }
          piVar9 = piVar9 + 1;
          pcVar8 = pcVar8 + 1;
        }
      }
      goto LAB_0025965e;
    }
    while (-1 < (int)uVar7) {
      local_288 = (int *)CONCAT44(local_288._4_4_,uVar7);
      iVar10 = local_208[uVar7];
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems._24_5_ = 0;
      local_308.data._M_elems[7]._1_3_ = 0;
      local_308.data._M_elems._32_5_ = 0;
      local_308.data._M_elems[9]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_308,
                 &(local_200->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar10].m_backend,&rhs[iVar10].m_backend
                );
      local_2c8.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
      local_2c8.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
      local_2c8.data._M_elems[4] = local_308.data._M_elems[4];
      local_2c8.data._M_elems[5] = local_308.data._M_elems[5];
      local_2c8.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
      local_2c8.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
      local_2c8.data._M_elems[0] = local_308.data._M_elems[0];
      local_2c8.data._M_elems[1] = local_308.data._M_elems[1];
      local_2c8.data._M_elems[2] = local_308.data._M_elems[2];
      local_2c8.data._M_elems[3] = local_308.data._M_elems[3];
      local_2c8.exp = local_308.exp;
      local_2c8.neg = local_308.neg;
      local_2c8.fpclass = local_308.fpclass;
      local_2c8.prec_elem = local_308.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&rhs[iVar10].m_backend,0);
      local_68.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
      local_68.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
      local_68.m_backend.data._M_elems[0] = local_2c8.data._M_elems[0];
      local_68.m_backend.data._M_elems[1] = local_2c8.data._M_elems[1];
      local_68.m_backend.data._M_elems[2] = local_2c8.data._M_elems[2];
      local_68.m_backend.data._M_elems[3] = local_2c8.data._M_elems[3];
      local_68.m_backend.data._M_elems[4] = local_2c8.data._M_elems[4];
      local_68.m_backend.data._M_elems[5] = local_2c8.data._M_elems[5];
      local_68.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
      local_68.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
      local_68.m_backend.exp = local_2c8.exp;
      local_68.m_backend.neg = local_2c8.neg;
      local_68.m_backend.fpclass = local_2c8.fpclass;
      local_68.m_backend.prec_elem = local_2c8.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_280->m_backend).data._M_elems;
      local_a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 2);
      local_a8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 4);
      local_a8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 6);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_280->m_backend).data._M_elems + 8);
      local_a8.m_backend.exp = (local_280->m_backend).exp;
      local_a8.m_backend.neg = (local_280->m_backend).neg;
      local_a8.m_backend.fpclass = (local_280->m_backend).fpclass;
      local_a8.m_backend.prec_elem = (local_280->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_68,&local_a8);
      if (bVar4) {
        iVar10 = local_218[uVar7];
        *(ulong *)(local_210[iVar10].m_backend.data._M_elems + 8) =
             CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_);
        puVar2 = local_210[iVar10].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_2c8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_);
        *(undefined8 *)local_210[iVar10].m_backend.data._M_elems = local_2c8.data._M_elems._0_8_;
        *(undefined8 *)(local_210[iVar10].m_backend.data._M_elems + 2) =
             local_2c8.data._M_elems._8_8_;
        local_210[iVar10].m_backend.exp = local_2c8.exp;
        local_210[iVar10].m_backend.neg = local_2c8.neg;
        local_210[iVar10].m_backend.fpclass = local_2c8.fpclass;
        local_210[iVar10].m_backend.prec_elem = local_2c8.prec_elem;
        piVar9 = local_220 + local_238[iVar10];
        pcVar8 = &local_228[local_238[iVar10]].m_backend;
        for (iVar6 = local_230[iVar10]; 0 < iVar6; iVar6 = iVar6 + -1) {
          local_308.fpclass = cpp_dec_float_finite;
          local_308.prec_elem = 10;
          local_308.data._M_elems[0] = 0;
          local_308.data._M_elems[1] = 0;
          local_308.data._M_elems[2] = 0;
          local_308.data._M_elems[3] = 0;
          local_308.data._M_elems[4] = 0;
          local_308.data._M_elems[5] = 0;
          local_308.data._M_elems._24_5_ = 0;
          local_308.data._M_elems[7]._1_3_ = 0;
          local_308.data._M_elems._32_5_ = 0;
          local_308.data._M_elems[9]._1_3_ = 0;
          local_308.exp = 0;
          local_308.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_308,&local_2c8,pcVar8);
          iVar10 = *piVar9;
          piVar9 = piVar9 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&rhs[iVar10].m_backend,&local_308);
          pcVar8 = pcVar8 + 1;
        }
      }
      uVar7 = (int)local_288 - 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}